

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O0

void __thiscall QBitArray::QBitArray(QBitArray *this,qsizetype size,bool value)

{
  byte ch;
  char *data;
  qsizetype storageSize;
  byte in_DL;
  qsizetype in_RSI;
  QByteArray *in_RDI;
  QByteArray *this_00;
  
  ch = in_DL & 1;
  this_00 = in_RDI;
  allocation_size((qsizetype)in_RDI);
  QByteArray::QByteArray(this_00,in_RSI,ch);
  if (0 < in_RSI) {
    data = QByteArray::data(in_RDI);
    storageSize = QByteArray::size(in_RDI);
    adjust_head_and_tail(data,storageSize,in_RSI);
  }
  return;
}

Assistant:

QBitArray::QBitArray(qsizetype size, bool value)
    : d(allocation_size(size), value ? 0xFF : 0x00)
{
    Q_ASSERT_X(size >= 0, "QBitArray::QBitArray", "Size must be greater than or equal to 0.");
    if (size <= 0)
        return;

    adjust_head_and_tail(d.data(), d.size(), size);
}